

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walRestartLog(Wal *pWal)

{
  int local_30;
  u32 local_2c;
  int notUsed;
  u32 salt1;
  WalCkptInfo *pInfo;
  int cnt;
  int rc;
  Wal *pWal_local;
  
  pInfo._4_4_ = 0;
  if (pWal->readLock == 0) {
    _cnt = pWal;
    _notUsed = walCkptInfo(pWal);
    if (_notUsed->nBackfill != 0) {
      sqlite3_randomness(4,&local_2c);
      pInfo._4_4_ = walLockExclusive(_cnt,4,4);
      if (pInfo._4_4_ == 0) {
        walRestartHdr(_cnt,local_2c);
        walUnlockExclusive(_cnt,4,4);
      }
      else if (pInfo._4_4_ != 5) {
        return pInfo._4_4_;
      }
    }
    walUnlockShared(_cnt,3);
    _cnt->readLock = -1;
    pInfo._0_4_ = 0;
    do {
      pInfo._0_4_ = (int)pInfo + 1;
      pInfo._4_4_ = walTryBeginRead(_cnt,&local_30,1,(int)pInfo);
    } while (pInfo._4_4_ == -1);
  }
  return pInfo._4_4_;
}

Assistant:

static int walRestartLog(Wal *pWal){
  int rc = SQLITE_OK;
  int cnt;

  if( pWal->readLock==0 ){
    volatile WalCkptInfo *pInfo = walCkptInfo(pWal);
    assert( pInfo->nBackfill==pWal->hdr.mxFrame );
    if( pInfo->nBackfill>0 ){
      u32 salt1;
      sqlite3_randomness(4, &salt1);
      rc = walLockExclusive(pWal, WAL_READ_LOCK(1), WAL_NREADER-1);
      if( rc==SQLITE_OK ){
        /* If all readers are using WAL_READ_LOCK(0) (in other words if no
        ** readers are currently using the WAL), then the transactions
        ** frames will overwrite the start of the existing log. Update the
        ** wal-index header to reflect this.
        **
        ** In theory it would be Ok to update the cache of the header only
        ** at this point. But updating the actual wal-index header is also
        ** safe and means there is no special case for sqlite3WalUndo()
        ** to handle if this transaction is rolled back.  */
        walRestartHdr(pWal, salt1);
        walUnlockExclusive(pWal, WAL_READ_LOCK(1), WAL_NREADER-1);
      }else if( rc!=SQLITE_BUSY ){
        return rc;
      }
    }
    walUnlockShared(pWal, WAL_READ_LOCK(0));
    pWal->readLock = -1;
    cnt = 0;
    do{
      int notUsed;
      rc = walTryBeginRead(pWal, &notUsed, 1, ++cnt);
    }while( rc==WAL_RETRY );
    assert( (rc&0xff)!=SQLITE_BUSY ); /* BUSY not possible when useWal==1 */
    testcase( (rc&0xff)==SQLITE_IOERR );
    testcase( rc==SQLITE_PROTOCOL );
    testcase( rc==SQLITE_OK );
  }
  return rc;
}